

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void (anonymous_namespace)::
     testTiledImageChannel<float,(Imf_3_4::PixelType)2,float,(Imf_3_4::PixelType)2>
               (char *fileName,int width,int height,Compression compression)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  float *pfVar5;
  int *piVar6;
  char *pcVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int x_1;
  int y_1;
  TiledInputFile in;
  FrameBuffer fb_1;
  Array2D<float> inPixels;
  TiledOutputFile out;
  FrameBuffer fb;
  Header hdr;
  int x;
  int y;
  Array2D<float> outPixels;
  Compression in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar8;
  float t2;
  float in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffd8c;
  Array2D<float> *in_stack_fffffffffffffd90;
  int local_1d8;
  int local_1d4;
  undefined1 local_1d0 [88];
  char local_178 [48];
  Array2D<float> local_148;
  undefined1 local_130 [88];
  char local_d8 [52];
  Channel local_a4 [16];
  TileDescription local_94;
  Vec2<float> local_78;
  TileDescription local_70 [3];
  int local_38;
  int local_34;
  Array2D<float> local_30;
  int local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::operator<<(poVar4,"output type ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::operator<<(poVar4,"input type ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
  poVar4 = std::operator<<(poVar4,":\n    ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  Imf_3_4::Array2D<float>::Array2D
            (in_stack_fffffffffffffd90,CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
             ,CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  for (local_34 = 0; iVar3 = local_c, iVar2 = local_10, local_34 < local_10; local_34 = local_34 + 1
      ) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      iVar2 = local_38 * 10 + local_34;
      pfVar5 = Imf_3_4::Array2D<float>::operator[](&local_30,(long)local_34);
      pfVar5[local_38] = (float)iVar2;
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_78,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_70,iVar3,iVar2,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::TileDescription::TileDescription(&local_94,0x43,0x43,ONE_LEVEL,ROUND_DOWN);
  Imf_3_4::Header::setTileDescription(local_70);
  piVar6 = (int *)Imf_3_4::Header::compression();
  *piVar6 = local_14;
  pcVar7 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_a4,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar7,(Channel *)0x22e4ae);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x16d9fc);
  pfVar5 = Imf_3_4::Array2D<float>::operator[](&local_30,0);
  uVar9 = 0;
  uVar8 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_130 + 0x20),FLOAT,(char *)pfVar5,4,(long)local_c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_d8,(Slice *)0x22e4ae);
  poVar4 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  pcVar7 = local_8;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)local_130,pcVar7,(Header *)local_70,iVar2);
  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_130);
  iVar2 = Imf_3_4::TiledOutputFile::numXTiles((int)local_130);
  iVar3 = Imf_3_4::TiledOutputFile::numYTiles((int)local_130);
  Imf_3_4::TiledOutputFile::writeTiles((int)local_130,0,iVar2 + -1,0,iVar3 + -1);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_130);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x16db61);
  Imf_3_4::Header::~Header((Header *)local_70);
  Imf_3_4::Array2D<float>::Array2D
            (in_stack_fffffffffffffd90,CONCAT44(in_stack_fffffffffffffd8c,uVar9),
             CONCAT44(in_stack_fffffffffffffd84,uVar8));
  poVar4 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x16dbc7);
  pfVar5 = Imf_3_4::Array2D<float>::operator[](&local_148,0);
  t2 = 0.0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_1d0 + 0x20),FLOAT,(char *)pfVar5,4,(long)local_c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_178,(Slice *)0x22e4ae);
  pcVar7 = local_8;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)local_1d0,pcVar7,iVar2);
  Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)local_1d0);
  iVar2 = Imf_3_4::TiledInputFile::numXTiles((int)local_1d0);
  iVar3 = Imf_3_4::TiledInputFile::numYTiles((int)local_1d0);
  Imf_3_4::TiledInputFile::readTiles((int)local_1d0,0,iVar2 + -1,0,iVar3 + -1);
  Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)CONCAT44(in_stack_fffffffffffffd84,t2))
  ;
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x16dcf7);
  poVar4 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  local_1d4 = 0;
  do {
    if (local_10 <= local_1d4) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      remove(local_8);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)CONCAT44(in_stack_fffffffffffffd84,t2));
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)CONCAT44(in_stack_fffffffffffffd84,t2));
      return;
    }
    for (local_1d8 = 0; local_1d8 < local_c; local_1d8 = local_1d8 + 1) {
      Imf_3_4::Array2D<float>::operator[](&local_148,(long)local_1d4);
      Imf_3_4::Array2D<float>::operator[](&local_30,(long)local_1d4);
      bVar1 = anon_unknown.dwarf_7fa20::isEquivalent<float>
                        (in_stack_fffffffffffffd84,t2,in_stack_fffffffffffffd7c);
      if (!bVar1) {
        __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                      ,0x129,
                      "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
                     );
      }
    }
    local_1d4 = local_1d4 + 1;
  } while( true );
}

Assistant:

void
testTiledImageChannel (
    const char fileName[], int width, int height, Compression compression)
{
    cout << "tiles, "
            "compression "
         << compression << ", "
         << "output type " << OutTypeTag << ", "
         << "input type " << InTypeTag << ":\n    " << flush;

    Array2D<OutType> outPixels (height, width);

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            outPixels[y][x] = x * 10 + y;

    {
        Header hdr (width, height);

        hdr.setTileDescription (TileDescription (67, 67, ONE_LEVEL));

        hdr.compression () = compression;

        hdr.channels ().insert (
            "X",                   // name
            Channel (OutTypeTag)); // type

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                OutTypeTag,                         // type
                (char*) &outPixels[0][0],           // base
                sizeof (outPixels[0][0]),           // xStride
                sizeof (outPixels[0][0]) * width)); // yStride

        cout << "writing " << flush;

        TiledOutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    Array2D<InType> inPixels (height, width);

    {
        cout << "reading " << flush;

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                InTypeTag,                         // type
                (char*) &inPixels[0][0],           // base
                sizeof (inPixels[0][0]),           // xStride
                sizeof (inPixels[0][0]) * width)); // yStride

        TiledInputFile in (fileName);
        in.setFrameBuffer (fb);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
    }

    cout << "comparing" << flush;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            assert (isEquivalent (
                inPixels[y][x], InType (outPixels[y][x]), compression));
        }
    }

    cout << endl;

    remove (fileName);
}